

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O1

Entity * QXmlStreamReaderPrivate::Entity::createLiteral
                   (Entity *__return_storage_ptr__,QLatin1StringView name,QLatin1StringView value)

{
  Data *data;
  char16_t *pcVar1;
  qsizetype qVar2;
  QString *pQVar3;
  QString *pQVar4;
  storage_type *psVar5;
  QString *pQVar6;
  char *__s;
  long in_FS_OFFSET;
  bool bVar7;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QString local_50;
  long local_38;
  
  __s = value.m_data;
  pQVar4 = (QString *)value.m_size;
  ba.m_size = name.m_data;
  pQVar6 = (QString *)name.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&__return_storage_ptr__->field_0x30 = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->value).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->value).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->name).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->value).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->name).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  psVar5 = (storage_type *)CONCAT71(0xaaaaaaaaaaaaaa,-1 < (long)pQVar6);
  pQVar3 = (QString *)0x0;
  if (0 < (long)pQVar6) {
    pQVar3 = pQVar6;
  }
  if (ba.m_size == (char *)0x0) {
    pQVar3 = (QString *)0x0;
  }
  if (ba.m_size != (char *)0x0 && -1 >= (long)pQVar6) {
    pQVar3 = (QString *)strlen(ba.m_size);
  }
  ba.m_data = psVar5;
  QString::fromLatin1(&local_50,pQVar3,ba);
  qVar2 = local_50.d.size;
  pcVar1 = local_50.d.ptr;
  data = local_50.d.d;
  pQVar3 = (QString *)0x0;
  if (0 < (long)pQVar4) {
    pQVar3 = pQVar4;
  }
  bVar7 = __s == (char *)0x0;
  if (bVar7) {
    pQVar3 = (QString *)0x0;
  }
  psVar5 = (storage_type *)CONCAT71((int7)((ulong)psVar5 >> 8),bVar7 || -1 < (long)pQVar4);
  if (!bVar7 && -1 >= (long)pQVar4) {
    pQVar3 = (QString *)strlen(__s);
  }
  ba_00.m_data = psVar5;
  ba_00.m_size = (qsizetype)__s;
  QString::fromLatin1(&local_50,pQVar3,ba_00);
  (__return_storage_ptr__->name).d.d = data;
  (__return_storage_ptr__->name).d.ptr = pcVar1;
  (__return_storage_ptr__->name).d.size = qVar2;
  if (&data->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (__return_storage_ptr__->value).d.d = local_50.d.d;
  (__return_storage_ptr__->value).d.ptr = local_50.d.ptr;
  (__return_storage_ptr__->value).d.size = local_50.d.size;
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  __return_storage_ptr__->field_0x30 = __return_storage_ptr__->field_0x30 & 0xe0;
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&data->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&data->super_QArrayData,2,0x10);
    }
  }
  __return_storage_ptr__->field_0x30 = __return_storage_ptr__->field_0x30 | 0xc;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static inline Entity createLiteral(QLatin1StringView name, QLatin1StringView value)
            { Entity result(name, value); result.literal = result.hasBeenParsed = true; return result; }